

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SequenceFeatureType::SequenceFeatureType
          (SequenceFeatureType *this,SequenceFeatureType *from)

{
  void *pvVar1;
  SizeRange *from_00;
  SizeRange *this_00;
  Int64FeatureType *this_01;
  StringFeatureType *this_02;
  Int64FeatureType *from_01;
  StringFeatureType *from_02;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SequenceFeatureType_00409a88;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->sizerange_;
  if (from_00 == (SizeRange *)0x0 ||
      from == (SequenceFeatureType *)&_SequenceFeatureType_default_instance_) {
    this_00 = (SizeRange *)0x0;
  }
  else {
    this_00 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(this_00,from_00);
  }
  this->sizerange_ = this_00;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 3) {
    clear_Type(this);
    this->_oneof_case_[0] = 3;
    this_02 = (StringFeatureType *)operator_new(0x18);
    StringFeatureType::StringFeatureType(this_02);
    (this->Type_).stringtype_ = this_02;
    if (from->_oneof_case_[0] == 3) {
      from_02 = (from->Type_).stringtype_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_02 = (StringFeatureType *)&_StringFeatureType_default_instance_;
    }
    StringFeatureType::MergeFrom(this_02,from_02);
  }
  else if (from->_oneof_case_[0] == 1) {
    clear_Type(this);
    this->_oneof_case_[0] = 1;
    this_01 = (Int64FeatureType *)operator_new(0x18);
    Int64FeatureType::Int64FeatureType(this_01);
    (this->Type_).int64type_ = this_01;
    if (from->_oneof_case_[0] == 1) {
      from_01 = (from->Type_).int64type_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_01 = (Int64FeatureType *)&_Int64FeatureType_default_instance_;
    }
    Int64FeatureType::MergeFrom(this_01,from_01);
  }
  return;
}

Assistant:

SequenceFeatureType::SequenceFeatureType(const SequenceFeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_sizerange()) {
    sizerange_ = new ::CoreML::Specification::SizeRange(*from.sizerange_);
  } else {
    sizerange_ = NULL;
  }
  clear_has_Type();
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SequenceFeatureType)
}